

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O3

void deqp::egl::chooseConfigReference
               (Library *egl,EGLDisplay display,vector<void_*,_std::allocator<void_*>_> *dst,
               vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
               *attributes)

{
  undefined1 uVar1;
  undefined1 uVar2;
  __normal_iterator<deqp::egl::SurfaceConfig_*,_std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>_>
  __first;
  pointer pSVar3;
  __normal_iterator<deqp::egl::SurfaceConfig_*,_std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>_>
  __last;
  vector<void_*,_std::allocator<void_*>_> *pvVar4;
  pointer ppvVar5;
  ulong uVar6;
  undefined1 *puVar7;
  long lVar8;
  bool bVar9;
  pointer ppvVar10;
  bool bVar11;
  AttribRule AVar12;
  vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> filteredConfigs;
  vector<void_*,_std::allocator<void_*>_> eglConfigs;
  vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> configs;
  vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_> configInfos;
  ConfigFilter configFilter;
  undefined1 local_18a;
  undefined1 local_189;
  __normal_iterator<deqp::egl::SurfaceConfig_*,_std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>_>
  local_188;
  vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> local_180;
  vector<void_*,_std::allocator<void_*>_> local_168;
  bool local_14c [4];
  vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_> local_148;
  vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_> local_128;
  __normal_iterator<deqp::egl::SurfaceConfig_*,_std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>_>
  local_108;
  vector<void_*,_std::allocator<void_*>_> *local_100;
  vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> local_f8;
  _Iter_comp_iter<deqp::egl::CompareConfigs> local_e0;
  _Iter_comp_iter<deqp::egl::CompareConfigs> local_d8;
  SurfaceConfig local_d0;
  
  eglu::getConfigs(&local_168,egl,display);
  local_128.super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>::resize
            (&local_128,
             (long)local_168.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_168.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  local_188._M_current = (SurfaceConfig *)attributes;
  local_100 = dst;
  if (local_168.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_168.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar8 = 0;
    uVar6 = 0;
    do {
      eglu::queryCoreConfigInfo
                (egl,display,
                 local_168.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar6],
                 (ConfigInfo *)
                 ((long)&(local_128.
                          super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>.
                          _M_impl.super__Vector_impl_data._M_start)->bufferSize + lVar8));
      eglu::queryExtConfigInfo
                (egl,display,
                 local_168.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar6],
                 (ConfigInfo *)
                 ((long)&(local_128.
                          super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>.
                          _M_impl.super__Vector_impl_data._M_start)->bufferSize + lVar8));
      uVar6 = uVar6 + 1;
      lVar8 = lVar8 + 0x98;
    } while (uVar6 < (ulong)((long)local_168.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_168.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_148.super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
  _M_impl.super__Vector_impl_data._M_finish = (SurfaceConfig *)0x0;
  local_148.super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (SurfaceConfig *)0x0;
  if (local_168.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_168.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar8 = 0;
    uVar6 = 0;
    ppvVar5 = local_168.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppvVar10 = local_168.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      local_d0.m_config = ppvVar10[uVar6];
      memcpy(&local_d0.m_info,
             (void *)((long)&(local_128.
                              super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start)->bufferSize + lVar8),0x98);
      pSVar3 = local_148.
               super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_148.
          super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          local_148.
          super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>::
        _M_realloc_insert<deqp::egl::SurfaceConfig>
                  (&local_148,
                   (iterator)
                   local_148.
                   super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_d0);
        ppvVar5 = local_168.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        ppvVar10 = local_168.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
      }
      else {
        memcpy(local_148.
               super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_d0,0xa0);
        local_148.
        super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
        _M_impl.super__Vector_impl_data._M_finish = pSVar3 + 1;
      }
      uVar6 = uVar6 + 1;
      lVar8 = lVar8 + 0x98;
    } while (uVar6 < (ulong)((long)ppvVar5 - (long)ppvVar10 >> 3));
  }
  SurfaceConfig::getDefaultRules();
  std::vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>::vector
            (&local_f8,
             (vector<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_> *
             )local_188._M_current);
  ConfigFilter::setValues((ConfigFilter *)&local_d0,&local_f8);
  if (local_f8.
      super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.
                          super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.
                          super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ConfigFilter::filter(&local_180,(ConfigFilter *)&local_d0,&local_148);
  local_188._M_current =
       local_180.
       super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_108._M_current =
       local_180.
       super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  ConfigFilter::getSpecifiedRGBColors((ConfigFilter *)local_14c);
  lVar8 = 0;
  local_189 = 0;
  local_18a = 0;
  puVar7 = &local_189;
  bVar11 = true;
  do {
    bVar9 = bVar11;
    AVar12 = ConfigFilter::getAttribute((ConfigFilter *)&local_d0,(&DAT_01ba5afc)[lVar8]);
    *puVar7 = AVar12._0_8_ - 0x100000000U < 0xfffffffe00000000;
    lVar8 = 1;
    puVar7 = &local_18a;
    bVar11 = false;
  } while (bVar9);
  AVar12 = ConfigFilter::getAttribute((ConfigFilter *)&local_d0,0x331a);
  __last._M_current = local_108._M_current;
  __first._M_current = local_188._M_current;
  uVar2 = local_189;
  uVar1 = local_18a;
  bVar11 = AVar12._0_8_ - 0x100000000U < 0xfffffffe00000000;
  if (local_188._M_current != local_108._M_current) {
    uVar6 = ((long)local_108._M_current - (long)local_188._M_current >> 5) * -0x3333333333333333;
    lVar8 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    local_d8._M_comp.m_specifiedRGBColors.m_data[0] = local_14c[0];
    local_d8._M_comp.m_specifiedRGBColors.m_data[1] = local_14c[1];
    local_d8._M_comp.m_specifiedRGBColors.m_data[2] = local_14c[2];
    local_d8._M_comp.m_specifiedRGBColors.m_data[3] = local_14c[3];
    local_d8._M_comp.m_specifiedLuminanceColors.m_data[0] = (bool)local_189;
    local_d8._M_comp.m_specifiedLuminanceColors.m_data[1] = (bool)local_18a;
    local_d8._M_comp.m_yuvPlaneBppSpecified = bVar11;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<deqp::egl::SurfaceConfig*,std::vector<deqp::egl::SurfaceConfig,std::allocator<deqp::egl::SurfaceConfig>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<deqp::egl::CompareConfigs>>
              (local_188,local_108,(ulong)(((uint)lVar8 ^ 0x3f) * 2) ^ 0x7e,&local_d8);
    local_e0._M_comp.m_specifiedRGBColors.m_data[0] = local_14c[0];
    local_e0._M_comp.m_specifiedRGBColors.m_data[1] = local_14c[1];
    local_e0._M_comp.m_specifiedRGBColors.m_data[2] = local_14c[2];
    local_e0._M_comp.m_specifiedRGBColors.m_data[3] = local_14c[3];
    local_e0._M_comp.m_specifiedLuminanceColors.m_data[0] = (bool)uVar2;
    local_e0._M_comp.m_specifiedLuminanceColors.m_data[1] = (bool)uVar1;
    local_e0._M_comp.m_yuvPlaneBppSpecified = bVar11;
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<deqp::egl::SurfaceConfig*,std::vector<deqp::egl::SurfaceConfig,std::allocator<deqp::egl::SurfaceConfig>>>,__gnu_cxx::__ops::_Iter_comp_iter<deqp::egl::CompareConfigs>>
              (__first,__last,&local_e0);
  }
  pvVar4 = local_100;
  std::vector<void_*,_std::allocator<void_*>_>::resize
            (local_100,
             ((long)local_180.
                    super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_180.
                    super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x3333333333333333);
  if (local_180.
      super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_180.
      super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar8 = 0;
    uVar6 = 0;
    do {
      (pvVar4->super__Vector_base<void_*,_std::allocator<void_*>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar6] =
           *(void **)((long)&(local_180.
                              super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_config + lVar8);
      uVar6 = uVar6 + 1;
      lVar8 = lVar8 + 0xa0;
    } while (uVar6 < (ulong)(((long)local_180.
                                    super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_180.
                                    super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5) *
                            -0x3333333333333333));
  }
  if (local_180.
      super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
      _M_impl.super__Vector_impl_data._M_start != (SurfaceConfig *)0x0) {
    operator_delete(local_180.
                    super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_180.
                          super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_180.
                          super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_deqp::egl::AttribRule>,_std::_Select1st<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_deqp::egl::AttribRule>,_std::_Select1st<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_deqp::egl::AttribRule>_>_>
               *)&local_d0);
  if (local_148.
      super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<deqp::egl::SurfaceConfig,_std::allocator<deqp::egl::SurfaceConfig>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_128.super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.
                    super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.
                          super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.
                          super__Vector_base<eglu::ConfigInfo,_std::allocator<eglu::ConfigInfo>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_168.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void chooseConfigReference (const Library& egl, EGLDisplay display, std::vector<EGLConfig>& dst, const std::vector<std::pair<EGLenum, EGLint> >& attributes)
{
	// Get all configs
	std::vector<EGLConfig> eglConfigs = eglu::getConfigs(egl, display);

	// Config infos - including extension attributes
	std::vector<ConfigInfo> configInfos;
	configInfos.resize(eglConfigs.size());

	for (size_t ndx = 0; ndx < eglConfigs.size(); ndx++)
	{
		eglu::queryCoreConfigInfo(egl, display, eglConfigs[ndx], &configInfos[ndx]);
		eglu::queryExtConfigInfo(egl, display, eglConfigs[ndx], &configInfos[ndx]);
	}

	// Pair configs with info
	std::vector<SurfaceConfig> configs;
	for (size_t ndx = 0; ndx < eglConfigs.size(); ndx++)
		configs.push_back(SurfaceConfig(eglConfigs[ndx], configInfos[ndx]));

	// Filter configs
	ConfigFilter configFilter;
	configFilter.setValues(attributes);

	std::vector<SurfaceConfig> filteredConfigs = configFilter.filter(configs);

	// Sort configs
	std::sort(filteredConfigs.begin(), filteredConfigs.end(), CompareConfigs(configFilter.getSpecifiedRGBColors(), configFilter.getSpecifiedLuminanceColors(), configFilter.isYuvPlaneBppSpecified()));

	// Write to dst list
	dst.resize(filteredConfigs.size());
	for (size_t ndx = 0; ndx < filteredConfigs.size(); ndx++)
		dst[ndx] = filteredConfigs[ndx].getEglConfig();
}